

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::PrefixOperator,bool,false,false>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool *pbVar6;
  ulong uVar7;
  bool bVar8;
  uint uVar9;
  idx_t iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  char acStack_6c [4];
  char *local_68;
  undefined8 local_60;
  char *local_58;
  bool *local_50;
  idx_t local_48;
  ulong local_40;
  unsigned_long *local_38;
  
  local_38 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_48 = count;
  local_50 = result_data;
  if (local_38 == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar10 = 0;
      do {
        local_58 = ldata[iVar10].value.pointer.ptr;
        local_68 = rdata[iVar10].value.pointer.ptr;
        local_60 = *(undefined8 *)&ldata[iVar10].value;
        uVar1 = (uint)*(ulong *)&rdata[iVar10].value;
        uVar9 = (uint)*(undefined8 *)&ldata[iVar10].value;
        if (uVar9 < uVar1) {
LAB_0110dc17:
          bVar8 = false;
        }
        else {
          uVar7 = *(ulong *)&rdata[iVar10].value & 0xffffffff;
          if (uVar1 < 5) {
            bVar8 = true;
            if (uVar1 != 0) {
              uVar5 = 0;
              do {
                if (*(char *)((long)&local_60 + uVar5 + 4) != acStack_6c[uVar5]) goto LAB_0110dc17;
                uVar5 = uVar5 + 1;
              } while (uVar7 != uVar5);
            }
          }
          else {
            lVar3 = 0;
            do {
              if (*(char *)((long)&local_60 + lVar3 + 4) != acStack_6c[lVar3]) goto LAB_0110dc17;
              lVar3 = lVar3 + 1;
            } while (lVar3 != 4);
            if (uVar9 < 0xd) {
              local_58 = (char *)((long)&local_60 + 4);
            }
            if (uVar1 < 0xd) {
              local_68 = acStack_6c;
            }
            uVar5 = 4;
            do {
              if (local_58[uVar5] != local_68[uVar5]) goto LAB_0110dc17;
              uVar5 = uVar5 + 1;
            } while (uVar7 != uVar5);
            bVar8 = true;
          }
        }
        result_data[iVar10] = bVar8;
        iVar10 = iVar10 + 1;
      } while (iVar10 != count);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_40 = count + 0x3f >> 6;
    uVar5 = 0;
    pbVar6 = result_data;
    uVar7 = 0;
    iVar10 = count;
    do {
      uVar13 = local_38[uVar5];
      uVar12 = uVar7 + 0x40;
      if (iVar10 <= uVar7 + 0x40) {
        uVar12 = iVar10;
      }
      uVar2 = uVar12;
      if (uVar13 != 0) {
        uVar2 = uVar7;
        if (uVar13 == 0xffffffffffffffff) {
          if (uVar7 < uVar12) {
            do {
              local_58 = ldata[uVar7].value.pointer.ptr;
              local_68 = rdata[uVar7].value.pointer.ptr;
              local_60 = *(undefined8 *)&ldata[uVar7].value;
              uVar1 = (uint)*(ulong *)&rdata[uVar7].value;
              uVar9 = (uint)*(undefined8 *)&ldata[uVar7].value;
              if (uVar9 < uVar1) {
LAB_0110da37:
                bVar8 = false;
              }
              else {
                uVar13 = *(ulong *)&rdata[uVar7].value & 0xffffffff;
                if (uVar1 < 5) {
                  bVar8 = true;
                  if (uVar1 != 0) {
                    uVar2 = 0;
                    do {
                      if (*(char *)((long)&local_60 + uVar2 + 4) != acStack_6c[uVar2])
                      goto LAB_0110da37;
                      uVar2 = uVar2 + 1;
                    } while (uVar13 != uVar2);
                  }
                }
                else {
                  lVar3 = 0;
                  do {
                    if (*(char *)((long)&local_60 + lVar3 + 4) != acStack_6c[lVar3])
                    goto LAB_0110da37;
                    lVar3 = lVar3 + 1;
                  } while (lVar3 != 4);
                  if (uVar9 < 0xd) {
                    local_58 = (char *)((long)&local_60 + 4);
                  }
                  if (uVar1 < 0xd) {
                    local_68 = acStack_6c;
                  }
                  uVar2 = 4;
                  do {
                    if (local_58[uVar2] != local_68[uVar2]) goto LAB_0110da37;
                    uVar2 = uVar2 + 1;
                  } while (uVar13 != uVar2);
                  bVar8 = true;
                }
              }
              pbVar6[uVar7] = bVar8;
              uVar7 = uVar7 + 1;
              uVar2 = uVar12;
            } while (uVar7 != uVar12);
          }
        }
        else {
          uVar11 = uVar7;
          if (uVar7 < uVar12) {
            do {
              if ((uVar13 >> ((ulong)(uint)((int)uVar11 - (int)uVar7) & 0x3f) & 1) != 0) {
                local_58 = ldata[uVar11].value.pointer.ptr;
                local_68 = rdata[uVar11].value.pointer.ptr;
                local_60 = *(undefined8 *)&ldata[uVar11].value;
                uVar9 = (uint)*(ulong *)&rdata[uVar11].value;
                uVar1 = (uint)*(undefined8 *)&ldata[uVar11].value;
                if (uVar1 < uVar9) {
LAB_0110db0b:
                  bVar8 = false;
                }
                else {
                  uVar2 = *(ulong *)&rdata[uVar11].value & 0xffffffff;
                  if (uVar9 < 5) {
                    bVar8 = true;
                    if (uVar9 != 0) {
                      uVar4 = 0;
                      do {
                        if (*(char *)((long)&local_60 + uVar4 + 4) != acStack_6c[uVar4])
                        goto LAB_0110db0b;
                        uVar4 = uVar4 + 1;
                      } while (uVar2 != uVar4);
                    }
                  }
                  else {
                    lVar3 = 0;
                    do {
                      if (*(char *)((long)&local_60 + lVar3 + 4) != acStack_6c[lVar3]) {
                        bVar8 = false;
                        pbVar6 = result_data;
                        iVar10 = count;
                        goto LAB_0110db0e;
                      }
                      lVar3 = lVar3 + 1;
                    } while (lVar3 != 4);
                    if (uVar1 < 0xd) {
                      local_58 = (char *)((long)&local_60 + 4);
                    }
                    if (uVar9 < 0xd) {
                      local_68 = acStack_6c;
                    }
                    uVar4 = 4;
                    do {
                      pbVar6 = local_50;
                      iVar10 = local_48;
                      if (local_58[uVar4] != local_68[uVar4]) goto LAB_0110db0b;
                      uVar4 = uVar4 + 1;
                    } while (uVar2 != uVar4);
                    bVar8 = true;
                  }
                }
LAB_0110db0e:
                pbVar6[uVar11] = bVar8;
              }
              uVar11 = uVar11 + 1;
              uVar2 = uVar12;
            } while (uVar11 != uVar12);
          }
        }
      }
      uVar5 = uVar5 + 1;
      uVar7 = uVar2;
    } while (uVar5 != local_40);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}